

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O0

Dictionary __thiscall QPDFObjectHandle::as_dictionary(QPDFObjectHandle *this,typed options)

{
  qpdf_object_type_e qVar1;
  byte in_DL;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined7 in_register_00000031;
  BaseHandle *this_00;
  Dictionary DVar3;
  shared_ptr<QPDFObject> local_30;
  byte local_19;
  BaseHandle *pBStack_18;
  typed options_local;
  QPDFObjectHandle *this_local;
  
  this_00 = (BaseHandle *)CONCAT71(in_register_00000031,options);
  pBStack_18 = this_00;
  this_local = this;
  if ((in_DL & 1) == 0) {
    local_19 = in_DL;
    qVar1 = ::qpdf::BaseHandle::type_code(this_00);
    if (qVar1 != ot_dictionary) {
      if ((local_19 & 2) != 0) {
        qVar1 = ::qpdf::BaseHandle::type_code(this_00);
        if (qVar1 == ot_null) goto LAB_001646ac;
      }
      if ((local_19 & 4) != 0) {
        assertType((QPDFObjectHandle *)this_00,"dictionary",false);
      }
      std::shared_ptr<QPDFObject>::shared_ptr(&local_30);
      ::qpdf::Dictionary::Dictionary((Dictionary *)this,&local_30);
      std::shared_ptr<QPDFObject>::~shared_ptr(&local_30);
      _Var2._M_pi = extraout_RDX_00;
      goto LAB_00164717;
    }
  }
LAB_001646ac:
  ::qpdf::Dictionary::Dictionary((Dictionary *)this,(shared_ptr<QPDFObject> *)this_00);
  _Var2._M_pi = extraout_RDX;
LAB_00164717:
  DVar3.super_BaseDictionary.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  DVar3.super_BaseDictionary.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Dictionary)
         DVar3.super_BaseDictionary.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline qpdf::Dictionary
QPDFObjectHandle::as_dictionary(qpdf::typed options) const
{
    if (options & qpdf::any_flag || type_code() == ::ot_dictionary ||
        (options & qpdf::optional && type_code() == ::ot_null)) {
        return qpdf::Dictionary(obj);
    }
    if (options & qpdf::error) {
        assertType("dictionary", false);
    }
    return qpdf::Dictionary(std::shared_ptr<QPDFObject>());
}